

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
helics::apps::AppTextParser::preParseFile
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AppTextParser *this,
          vector<char,_std::allocator<char>_> *klines)

{
  ifstream *piVar1;
  int *piVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  char cVar6;
  istream *piVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<char,_std::allocator<char>_> *local_38;
  
  piVar1 = &this->filePtr;
  std::ifstream::close();
  std::ifstream::open((string *)piVar1,(int)this + 0x230);
  this->mLineComment = false;
  local_38 = klines;
  CLI::std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (size_type)
             ((klines->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
             (1 - (long)(klines->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start)),(allocator_type *)&local_78);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  bVar12 = false;
  do {
    do {
      cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)piVar1,(string *)&local_78,cVar6);
      sVar5 = local_78._M_string_length;
      _Var4._M_p = local_78._M_dataplus._M_p;
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        return __return_storage_ptr__;
      }
    } while (local_78._M_string_length == 0);
    uVar10 = 2;
    do {
      cVar6 = _Var4._M_p[uVar10 - 2];
      pvVar8 = memchr(" \t\n\r",(int)cVar6,4);
      if (pvVar8 == (void *)0x0) {
        if (uVar10 != 1) {
          if (bVar12) {
            bVar12 = true;
            if (((uVar10 < sVar5) && (bVar12 = true, cVar6 == '#')) &&
               (_Var4._M_p[uVar10 - 1] == '#')) {
              bVar12 = _Var4._M_p[uVar10] != ']';
            }
          }
          else if (cVar6 == '!') {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_58,&local_78,uVar10 - 1,0xffffffffffffffff);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &this->configStr,local_58._M_dataplus._M_p,local_58._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            bVar12 = false;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &this->configStr,'\n');
          }
          else if (cVar6 == '#') {
            bVar12 = false;
            if ((uVar10 < sVar5) && (bVar12 = false, _Var4._M_p[uVar10 - 1] == '#')) {
              bVar12 = _Var4._M_p[uVar10] == '[';
            }
          }
          else {
            piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            *piVar2 = *piVar2 + 1;
            pcVar3 = (local_38->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            bVar12 = false;
            lVar9 = (long)(local_38->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pcVar3;
            if (lVar9 != 0) {
              lVar11 = 0;
              do {
                if (_Var4._M_p[uVar10 - 2] == pcVar3[lVar11]) {
                  piVar2[lVar11 + 1] = piVar2[lVar11 + 1] + 1;
                }
                lVar11 = lVar11 + 1;
                bVar12 = false;
              } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
            }
          }
        }
        break;
      }
      lVar9 = uVar10 - sVar5;
      uVar10 = uVar10 + 1;
    } while (lVar9 != 1);
  } while( true );
}

Assistant:

std::vector<int> AppTextParser::preParseFile(const std::vector<char>& klines)
{
    reset();
    std::vector<int> counts(1 + klines.size());
    std::string str;
    bool inMline{false};
    // count the lines
    while (std::getline(filePtr, str)) {
        if (str.empty()) {
            continue;
        }
        auto firstChar = str.find_first_not_of(" \t\n\r\0");
        if (firstChar == std::string::npos) {
            continue;
        }
        if (inMline) {
            if (firstChar + 2 < str.size()) {
                if ((str[firstChar] == '#') && (str[firstChar + 1] == '#') &&
                    (str[firstChar + 2] == ']')) {
                    inMline = false;
                }
            }
            continue;
        }
        if (str[firstChar] == '#') {
            if (firstChar + 2 < str.size()) {
                if ((str[firstChar + 1] == '#') && (str[firstChar + 2] == '[')) {
                    inMline = true;
                }
            }
            continue;
        }
        if (str[firstChar] == '!') {
            configStr += str.substr(firstChar + 1);
            configStr.push_back('\n');
            continue;
        }

        ++counts[0];
        for (std::size_t ii = 0; ii < klines.size(); ++ii) {
            if (str[firstChar] == klines[ii]) {
                ++counts[ii + 1];
            }
        }
    }
    return counts;
}